

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O3

bool __thiscall Router::Reachable(Router *this,Vec2 pos)

{
  float *pfVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  pointer pvVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  
  fVar7 = pos.x;
  fVar8 = pos.y;
  bVar2 = false;
  bVar3 = false;
  if ((((0.0 <= fVar7) && (bVar3 = bVar2, fVar7 <= 60.0)) && (0.0 <= fVar8)) && (fVar8 <= 90.0)) {
    uVar4 = (ulong)this->ObstacleCount;
    if ((long)uVar4 < 1) {
      return true;
    }
    pvVar5 = (this->Obstacles).
             super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = 0;
    do {
      pfVar1 = *(float **)
                &(pvVar5->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
                 super__Vector_impl_data;
      if (((*pfVar1 + -0.05 + -0.0001 < fVar7) && (fVar7 < pfVar1[4] + 0.05 + 0.0001)) &&
         ((pfVar1[1] + -0.05 + -0.0001 < fVar8 && (fVar8 < pfVar1[5] + 0.05 + 0.0001)))) {
        return false;
      }
      uVar6 = uVar6 + 1;
      pvVar5 = pvVar5 + 1;
    } while (uVar4 != uVar6);
    bVar3 = uVar4 <= uVar6;
  }
  return bVar3;
}

Assistant:

bool Router::Reachable(Vec2 pos)
{
    if (pos.x < 0 || pos.x > MapWidth || pos.y < 0 || pos.y > MapHeight)
        return false;
    for (int i = 0; i < ObstacleCount; ++i)
        if (pos.x > Obstacles[i][0].x - ObsBorder - EPS
            && pos.x < Obstacles[i][2].x + ObsBorder + EPS
            && pos.y > Obstacles[i][0].y - ObsBorder - EPS
            && pos.y < Obstacles[i][2].y + ObsBorder + EPS)
            return false;
    return true;
}